

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O2

Curl_addrinfo * Curl_str2addr(char *address,int port)

{
  int iVar1;
  Curl_addrinfo *pCVar2;
  in6_addr *inaddr;
  in_addr in;
  in6_addr in6;
  
  iVar1 = inet_pton(2,address,&in);
  if (iVar1 < 1) {
    iVar1 = inet_pton(10,address,&in6);
    if (iVar1 < 1) {
      return (Curl_addrinfo *)0x0;
    }
    iVar1 = 10;
    inaddr = &in6;
  }
  else {
    iVar1 = 2;
    inaddr = (in6_addr *)&in;
  }
  pCVar2 = Curl_ip2addr(iVar1,inaddr,address,port);
  return pCVar2;
}

Assistant:

Curl_addrinfo *Curl_str2addr(char *address, int port)
{
  struct in_addr in;
  if(Curl_inet_pton(AF_INET, address, &in) > 0)
    /* This is a dotted IP address 123.123.123.123-style */
    return Curl_ip2addr(AF_INET, &in, address, port);
#ifdef ENABLE_IPV6
  {
    struct in6_addr in6;
    if(Curl_inet_pton(AF_INET6, address, &in6) > 0)
      /* This is a dotted IPv6 address ::1-style */
      return Curl_ip2addr(AF_INET6, &in6, address, port);
  }
#endif
  return NULL; /* bad input format */
}